

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::CoverageIffClauseSyntax::setChild
          (CoverageIffClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00481660 + *(int *)(&DAT_00481660 + index * 4)))();
  return;
}

Assistant:

void CoverageIffClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: iff = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}